

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-unix.c
# Opt level: O0

size_t cilkos_getenv(char *value,size_t vallen,char *varname)

{
  char *dest;
  char *in_RDX;
  char *in_RSI;
  undefined1 *in_RDI;
  size_t len;
  char *envstr;
  rsize_t in_stack_ffffffffffffffd0;
  char *local_8;
  
  if (in_RDI == (undefined1 *)0x0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/os-unix.c"
                  ,0x1e3,"value");
  }
  if (in_RDX != (char *)0x0) {
    dest = getenv(in_RDX);
    if (dest == (char *)0x0) {
      *in_RDI = 0;
      local_8 = (char *)0x0;
    }
    else {
      local_8 = (char *)strnlen_s(dest,in_stack_ffffffffffffffd0);
      if (in_RSI + -1 < local_8) {
        local_8 = local_8 + 1;
      }
      else {
        strcpy_s(in_RSI,(rsize_t)in_RDX,dest);
      }
    }
    return (size_t)local_8;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/os-unix.c"
                ,0x1e4,"varname");
}

Assistant:

size_t cilkos_getenv(char* value, __STDNS size_t vallen,
                                           const char* varname)
{
    CILK_ASSERT(value);
    CILK_ASSERT(varname);

    const char* envstr = getenv(varname);
    if (envstr)
    {
        size_t len = cilk_strlen(envstr);
        if (len > vallen - 1)
            return len + 1;
        cilk_strcpy_s(value, vallen, envstr);
        return len;
    }
    else
    {
        value[0] = '\0';
        return 0;
    }
}